

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugNodeViewport(ImGuiViewportP *viewport)

{
  uint uVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  uint *in_RDI;
  char *pcVar5;
  int draw_list_i;
  int layer_i;
  ImGuiWindowFlags flags;
  char *in_stack_00000300;
  ImDrawList *in_stack_00000308;
  ImGuiWindow *in_stack_00000310;
  int local_14;
  int local_10;
  
  SetNextItemOpen(true,2);
  bVar2 = TreeNode("viewport0","Viewport #%d",0);
  if (bVar2) {
    uVar1 = *in_RDI;
    BulletText((char *)(double)(float)in_RDI[1],(double)(float)in_RDI[2],(double)(float)in_RDI[3],
               (double)(float)in_RDI[4],(double)(float)in_RDI[0x24],(double)(float)in_RDI[0x25],
               (double)(float)in_RDI[0x26],(double)(float)in_RDI[0x27],
               "Main Pos: (%.0f,%.0f), Size: (%.0f,%.0f)\nWorkArea Offset Left: %.0f Top: %.0f, Right: %.0f, Bottom: %.0f"
              );
    pcVar4 = "";
    if ((uVar1 & 1) != 0) {
      pcVar4 = " IsPlatformWindow";
    }
    pcVar3 = "";
    if ((uVar1 & 2) != 0) {
      pcVar3 = " IsPlatformMonitor";
    }
    pcVar5 = "";
    if ((uVar1 & 4) != 0) {
      pcVar5 = " OwnedByApp";
    }
    BulletText("Flags: 0x%04X =%s%s%s",(ulong)*in_RDI,pcVar4,pcVar3,pcVar5);
    for (local_10 = 0; local_10 < 2; local_10 = local_10 + 1) {
      for (local_14 = 0; local_14 < (int)in_RDI[(long)local_10 * 4 + 0x1c]; local_14 = local_14 + 1)
      {
        ImVector<ImDrawList_*>::operator[]
                  ((ImVector<ImDrawList_*> *)(in_RDI + (long)local_10 * 4 + 0x1c),local_14);
        DebugNodeDrawList(in_stack_00000310,in_stack_00000308,in_stack_00000300);
      }
    }
    TreePop();
  }
  return;
}

Assistant:

void ImGui::DebugNodeViewport(ImGuiViewportP* viewport)
{
    SetNextItemOpen(true, ImGuiCond_Once);
    if (TreeNode("viewport0", "Viewport #%d", 0))
    {
        ImGuiWindowFlags flags = viewport->Flags;
        BulletText("Main Pos: (%.0f,%.0f), Size: (%.0f,%.0f)\nWorkArea Offset Left: %.0f Top: %.0f, Right: %.0f, Bottom: %.0f",
            viewport->Pos.x, viewport->Pos.y, viewport->Size.x, viewport->Size.y,
            viewport->WorkOffsetMin.x, viewport->WorkOffsetMin.y, viewport->WorkOffsetMax.x, viewport->WorkOffsetMax.y);
        BulletText("Flags: 0x%04X =%s%s%s", viewport->Flags,
            (flags & ImGuiViewportFlags_IsPlatformWindow)  ? " IsPlatformWindow"  : "", 
            (flags & ImGuiViewportFlags_IsPlatformMonitor) ? " IsPlatformMonitor" : "",
            (flags & ImGuiViewportFlags_OwnedByApp)        ? " OwnedByApp"        : "");
        for (int layer_i = 0; layer_i < IM_ARRAYSIZE(viewport->DrawDataBuilder.Layers); layer_i++)
            for (int draw_list_i = 0; draw_list_i < viewport->DrawDataBuilder.Layers[layer_i].Size; draw_list_i++)
                DebugNodeDrawList(NULL, viewport->DrawDataBuilder.Layers[layer_i][draw_list_i], "DrawList");
        TreePop();
    }
}